

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O1

void __thiscall Assimp::AMFImporter::ParseFile(AMFImporter *this,string *pFile,IOSystem *pIOHandler)

{
  IrrXMLReader *pIVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  CIrrXML_IOStreamReader *this_00;
  IrrXMLReader *pIVar4;
  long *plVar5;
  runtime_error *prVar6;
  size_type *psVar7;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  IOStream *_stream;
  
  pIVar1 = this->mReader;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"rb","");
  iVar3 = (*pIOHandler->_vptr_IOSystem[4])
                    (pIOHandler,(pFile->_M_dataplus)._M_p,local_70._M_dataplus._M_p);
  _stream = (IOStream *)CONCAT44(extraout_var,iVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (_stream == (IOStream *)0x0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_50,"Failed to open AMF file ",pFile);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70._M_dataplus._M_p = (pointer)*plVar5;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_70._M_dataplus._M_p == psVar7) {
      local_70.field_2._M_allocated_capacity = *psVar7;
      local_70.field_2._8_8_ = plVar5[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar7;
    }
    local_70._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::runtime_error::runtime_error(prVar6,(string *)&local_70);
    *(undefined ***)prVar6 = &PTR__runtime_error_007fa260;
    __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = (CIrrXML_IOStreamReader *)operator_new(0x30);
  CIrrXML_IOStreamReader::CIrrXML_IOStreamReader(this_00,_stream);
  pIVar4 = irr::io::createIrrXMLReader((IFileReadCallBack *)this_00);
  this->mReader = pIVar4;
  if (pIVar4 == (IrrXMLReader *)0x0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_50,"Failed to create XML reader for file",pFile);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70._M_dataplus._M_p = (pointer)*plVar5;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_70._M_dataplus._M_p == psVar7) {
      local_70.field_2._M_allocated_capacity = *psVar7;
      local_70.field_2._8_8_ = plVar5[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar7;
    }
    local_70._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::runtime_error::runtime_error(prVar6,(string *)&local_70);
    *(undefined ***)prVar6 = &PTR__runtime_error_007fa260;
    __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"amf","");
  bVar2 = XML_SearchNode(this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    ParseNode_Root(this);
    if (this->mReader != (IrrXMLReader *)0x0) {
      (*this->mReader->_vptr_IIrrXMLReader[1])();
    }
    this->mReader = pIVar1;
    (*(this_00->super_IFileReadCallBack)._vptr_IFileReadCallBack[1])(this_00);
    (*_stream->_vptr_IOStream[1])(_stream);
    return;
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"Root node \"amf\" not found.","");
  std::runtime_error::runtime_error(prVar6,(string *)&local_70);
  *(undefined ***)prVar6 = &PTR__runtime_error_007fa260;
  __cxa_throw(prVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AMFImporter::ParseFile(const std::string& pFile, IOSystem* pIOHandler)
{
    irr::io::IrrXMLReader* OldReader = mReader;// store current XMLreader.
    std::unique_ptr<IOStream> file(pIOHandler->Open(pFile, "rb"));

	// Check whether we can read from the file
	if(file.get() == NULL) throw DeadlyImportError("Failed to open AMF file " + pFile + ".");

	// generate a XML reader for it
	std::unique_ptr<CIrrXML_IOStreamReader> mIOWrapper(new CIrrXML_IOStreamReader(file.get()));
	mReader = irr::io::createIrrXMLReader(mIOWrapper.get());
	if(!mReader) throw DeadlyImportError("Failed to create XML reader for file" + pFile + ".");
	//
	// start reading
	// search for root tag <amf>
	if(XML_SearchNode("amf"))
		ParseNode_Root();
	else
		throw DeadlyImportError("Root node \"amf\" not found.");

	delete mReader;
	// restore old XMLreader
	mReader = OldReader;
}